

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

bool __thiscall Expr::RequiresAnalyzerContext(Expr *this)

{
  ExprType EVar1;
  bool bVar2;
  pointer ppCVar3;
  pointer ppEVar4;
  long lVar5;
  bool bVar6;
  
  for (; EVar1 = this->expr_type_, EVar1 == EXPR_MEMBER; this = this->operand_[0]) {
  }
  if (EVar1 != EXPR_ID) {
    if (EVar1 == EXPR_CALLARGS) {
      if (this->args_ != (ExprList *)0x0) {
        ppEVar4 = (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          bVar6 = ppEVar4 ==
                  (this->args_->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
          bVar2 = !bVar6;
          if (bVar6) {
            return bVar2;
          }
          bVar6 = RequiresAnalyzerContext(*ppEVar4);
          ppEVar4 = ppEVar4 + 1;
        } while (!bVar6);
        return bVar2;
      }
    }
    else if (EVar1 == EXPR_CASE) {
      if (this->cases_ != (CaseExprList *)0x0) {
        ppCVar3 = (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          bVar6 = ppCVar3 ==
                  (this->cases_->super__Vector_base<CaseExpr_*,_std::allocator<CaseExpr_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
          bVar2 = !bVar6;
          if (bVar6) {
            return bVar2;
          }
          bVar6 = CaseExpr::RequiresAnalyzerContext(*ppCVar3);
          ppCVar3 = ppCVar3 + 1;
        } while (!bVar6);
        return bVar2;
      }
    }
    else {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        if ((this->operand_[lVar5] != (Expr *)0x0) &&
           (bVar2 = RequiresAnalyzerContext(this->operand_[lVar5]), bVar2)) {
          if (FLAGS_pac_debug != true) {
            return true;
          }
          fprintf(_stderr,"\'%s\' requires analyzer context\n",
                  (this->operand_[lVar5]->orig_)._M_dataplus._M_p);
          return true;
        }
      }
    }
    return false;
  }
  bVar2 = ID::operator==(this->id_,analyzer_context_id);
  return bVar2;
}

Assistant:

bool Expr::RequiresAnalyzerContext() const
	{
	switch ( expr_type_ )
		{
		case EXPR_ID:
			return *id_ == *analyzer_context_id;

		case EXPR_MEMBER:
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			return operand_[0]->RequiresAnalyzerContext();

		case EXPR_CALLARGS:
			{
			foreach (i, ExprList, args_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		case EXPR_CASE:
			{
			foreach (i, CaseExprList, cases_)
				if ( (*i)->RequiresAnalyzerContext() )
					return true;
			}
			return false;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] && operand_[i]->RequiresAnalyzerContext() )
					{
					DEBUG_MSG("'%s' requires analyzer context\n", operand_[i]->orig());
					return true;
					}
			return false;
		}
	}